

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_type_pattern_check(ly_ctx *ctx,char *pattern,pcre2_code_8 **code)

{
  undefined *puVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *__haystack;
  long lVar6;
  char *pcVar7;
  pcre2_code_8 *ppVar8;
  byte bVar9;
  LY_ERR LVar10;
  byte *pbVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int err_code;
  size_t err_offset;
  PCRE2_UCHAR8 err_msg [256];
  char *pcVar16;
  char *pcVar17;
  undefined4 local_174;
  char *local_170;
  char *local_168;
  char *local_160;
  pcre2_code_8 **local_158;
  char *local_150;
  char *local_148;
  long local_140;
  char local_138 [264];
  
  sVar5 = strlen(pattern);
  sVar5 = sVar5 + 1;
  __haystack = (char *)malloc(sVar5);
  if (__haystack == (char *)0x0) {
LAB_00145b8d:
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_pattern_check")
    ;
    return LY_EMEM;
  }
  *__haystack = '\0';
  lVar6 = 0;
  lVar13 = 0;
  pbVar11 = (byte *)pattern;
  local_158 = code;
  do {
    bVar3 = false;
    for (; bVar9 = *pbVar11, bVar9 == 0x5c; pbVar11 = pbVar11 + 1) {
      bVar3 = (bool)(bVar3 ^ 1);
      __haystack[lVar13] = '\\';
      lVar13 = lVar13 + 1;
    }
    if (bVar9 < 0x5b) {
      if (bVar9 == 0) {
        __haystack[lVar13] = '\0';
        pcVar17 = strstr(__haystack,"\\p{Is");
        pcVar16 = __haystack;
        break;
      }
      if (bVar9 == 0x24) {
LAB_001458ef:
        if (lVar6 == 0) {
          sVar5 = sVar5 + 1;
          __haystack = (char *)ly_realloc(__haystack,sVar5);
          if (__haystack == (char *)0x0) goto LAB_00145b8d;
          __haystack[lVar13] = '\\';
          lVar13 = lVar13 + 1;
          bVar9 = *pbVar11;
          lVar6 = 0;
        }
      }
    }
    else if (bVar9 == 0x5b) {
      lVar6 = lVar6 + (ulong)!bVar3;
      bVar9 = 0x5b;
    }
    else if (bVar9 == 0x5d) {
      if (!bVar3 && lVar6 == 0) {
        pcVar17 = "character group doesn\'t begin with \'[\'";
        goto LAB_00145c23;
      }
      lVar6 = lVar6 - (ulong)!bVar3;
      bVar9 = 0x5d;
    }
    else if (bVar9 == 0x5e) goto LAB_001458ef;
    __haystack[lVar13] = bVar9;
    lVar13 = lVar13 + 1;
    pbVar11 = pbVar11 + 1;
  } while( true );
joined_r0x0014596b:
  if (pcVar17 == (char *)0x0) {
    ppVar8 = (pcre2_code_8 *)
             pcre2_compile_8(__haystack,0xffffffffffffffff,0xa00a2010,&local_174,&local_140,0);
    if (ppVar8 != (pcre2_code_8 *)0x0) {
      free(__haystack);
      if (local_158 == (pcre2_code_8 **)0x0) {
        pcre2_code_free_8(ppVar8);
      }
      else {
        *local_158 = ppVar8;
      }
      return LY_SUCCESS;
    }
    pcVar17 = local_138;
    memset(pcVar17,0,0x100);
    pcre2_get_error_message_8(local_174,pcVar17,0x100);
    pbVar11 = (byte *)(__haystack + local_140);
LAB_00145c23:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Regular expression \"%s\" is not valid (\"%s\": %s).",
            pattern,pbVar11,pcVar17);
    free(__haystack);
    return LY_EVALID;
  }
  lVar6 = (long)pcVar17 - (long)pcVar16;
  local_160 = pattern;
  pcVar7 = strchr(pcVar17,0x7d);
  if (pcVar7 == (char *)0x0) {
    pcVar17 = pcVar16 + lVar6 + 2;
    pcVar16 = "unterminated character property";
LAB_00145bc6:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Regular expression \"%s\" is not valid (\"%s\": %s).",
            pattern,pcVar17,pcVar16);
    LVar10 = LY_EVALID;
LAB_00145bd2:
    free(__haystack);
    return LVar10;
  }
  local_168 = pcVar7 + (1 - (long)pcVar16);
  uVar14 = (long)local_168 - lVar6;
  pcVar7 = pcVar16;
  local_148 = pcVar17;
  if (uVar14 < 0x13) {
    sVar5 = strlen(pcVar16);
    pcVar7 = (char *)ly_realloc(pcVar16,(sVar5 - uVar14) + 0x14);
    __haystack = pcVar7;
    if (pcVar7 == (char *)0x0) {
      __haystack = (char *)0x0;
      LVar10 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_pattern_chblocks_xmlschema2perl");
      goto LAB_00145bd2;
    }
  }
  local_170 = pcVar7 + lVar6;
  pcVar17 = pcVar7 + lVar6 + 5;
  lVar13 = 0x10;
  pcVar12 = "BasicLatin";
  local_150 = pcVar16;
  while( true ) {
    sVar5 = strlen(pcVar12);
    iVar4 = strncmp(pcVar17,pcVar12,sVar5);
    pcVar16 = local_170;
    if (iVar4 == 0) break;
    pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_6c9f1_001fd9d0 + lVar13);
    lVar13 = lVar13 + 0x10;
    if (lVar13 == 0x550) {
      pcVar16 = "unknown block name";
      pattern = local_160;
      goto LAB_00145bc6;
    }
  }
  if (local_148 == local_150) {
LAB_00145acf:
    pcVar17 = local_170 + 0x13;
    pcVar12 = pcVar7 + (long)local_168;
    sVar5 = strlen(pcVar12);
    memmove(pcVar17,pcVar12,sVar5 + 1);
    builtin_strncpy(pcVar16,"[\\x{0000}-\\x{007F}]",0x13);
  }
  else {
    lVar15 = 0;
    lVar13 = 0;
    do {
      if (pcVar7[lVar13] == ']') {
        if ((lVar13 == 0) || (pcVar7[lVar13 + -1] != '\\')) {
          lVar15 = lVar15 + -1;
        }
      }
      else if ((pcVar7[lVar13] == '[') && ((lVar13 == 0 || (pcVar7[lVar13 + -1] != '\\')))) {
        lVar15 = lVar15 + 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar6 != lVar13);
    if (lVar15 == 0) goto LAB_00145acf;
    pcVar17 = local_170 + 0x11;
    pcVar12 = pcVar7 + (long)local_168;
    sVar5 = strlen(pcVar12);
    memmove(pcVar17,pcVar12,sVar5 + 1);
    puVar1 = (&PTR_anon_var_dwarf_6c9fc_001fd9d8)[lVar15 * 2];
    uVar2 = *(undefined8 *)(puVar1 + 9);
    *(undefined8 *)pcVar16 = *(undefined8 *)(puVar1 + 1);
    *(undefined8 *)(pcVar16 + 8) = uVar2;
    pcVar16[0x10] = puVar1[0x11];
  }
  pcVar17 = strstr(pcVar7,"\\p{Is");
  pattern = local_160;
  pcVar16 = pcVar7;
  goto joined_r0x0014596b;
}

Assistant:

LY_ERR
lys_compile_type_pattern_check(const struct ly_ctx *ctx, const char *pattern, pcre2_code **code)
{
    size_t idx, size, brack;
    char *perl_regex;
    int err_code, compile_opts;
    const char *orig_ptr;
    PCRE2_SIZE err_offset;
    pcre2_code *code_local;
    ly_bool escaped;
    LY_ERR r;

    /* adjust the expression to a Perl equivalent
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs */

    /* allocate space for the transformed pattern */
    size = strlen(pattern) + 1;
    compile_opts = PCRE2_UTF | PCRE2_UCP | PCRE2_ANCHORED | PCRE2_DOLLAR_ENDONLY | PCRE2_NO_AUTO_CAPTURE;
#ifdef PCRE2_ENDANCHORED
    compile_opts |= PCRE2_ENDANCHORED;
#else
    /* add space for trailing $ anchor */
    size++;
#endif
    perl_regex = malloc(size);
    LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);
    perl_regex[0] = '\0';

    /* we need to replace all "$" and "^" (that are not in "[]") with "\$" and "\^" */
    brack = 0;
    idx = 0;
    escaped = 0;
    orig_ptr = pattern;
    while (orig_ptr[0]) {
        switch (orig_ptr[0]) {
        case '$':
        case '^':
            if (!brack) {
                /* make space for the extra character */
                ++size;
                perl_regex = ly_realloc(perl_regex, size);
                LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);

                /* print escape slash */
                perl_regex[idx] = '\\';
                ++idx;
            }
            break;
        case '\\':
            /*  escape character found or backslash is escaped */
            escaped = !escaped;
            /* copy backslash and continue with the next character */
            perl_regex[idx] = orig_ptr[0];
            ++idx;
            ++orig_ptr;
            continue;
        case '[':
            if (!escaped) {
                ++brack;
            }
            break;
        case ']':
            if (!brack && !escaped) {
                /* If ']' does not terminate a character class expression, then pcre2_compile() implicitly escapes the
                 * ']' character. But this seems to be against the regular expressions rules declared in
                 * "XML schema: Datatypes" and therefore an error is returned. So for example if pattern is '\[a]' then
                 * pcre2 match characters '[a]' literally but in YANG such pattern is not allowed.
                 */
                LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, orig_ptr, "character group doesn't begin with '['");
                free(perl_regex);
                return LY_EVALID;
            } else if (!escaped) {
                --brack;
            }
            break;
        default:
            break;
        }

        /* copy char */
        perl_regex[idx] = orig_ptr[0];

        ++idx;
        ++orig_ptr;
        escaped = 0;
    }
#ifndef PCRE2_ENDANCHORED
    /* anchor match to end of subject */
    perl_regex[idx++] = '$';
#endif
    perl_regex[idx] = '\0';

    /* transform character blocks */
    if ((r = lys_compile_pattern_chblocks_xmlschema2perl(ctx, pattern, &perl_regex))) {
        free(perl_regex);
        return r;
    }

    /* must return 0, already checked during parsing */
    code_local = pcre2_compile((PCRE2_SPTR)perl_regex, PCRE2_ZERO_TERMINATED, compile_opts,
            &err_code, &err_offset, NULL);
    if (!code_local) {
        PCRE2_UCHAR err_msg[LY_PCRE2_MSG_LIMIT] = {0};

        pcre2_get_error_message(err_code, err_msg, LY_PCRE2_MSG_LIMIT);
        LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return LY_EVALID;
    }
    free(perl_regex);

    if (code) {
        *code = code_local;
    } else {
        pcre2_code_free(code_local);
    }

    return LY_SUCCESS;

#undef URANGE_LEN
}